

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

char * SDL_VideoDriverName(char *namebuf,int maxlen)

{
  char *pcVar1;
  int maxlen_local;
  char *namebuf_local;
  
  pcVar1 = (*SDL20_GetCurrentVideoDriver)();
  pcVar1 = GetDriverName(pcVar1,namebuf,maxlen);
  return pcVar1;
}

Assistant:

DECLSPEC12 const char * SDLCALL
SDL_VideoDriverName(char *namebuf, int maxlen)
{
#ifdef __WINDOWS__
    const char *val = SDL20_getenv("SDL_VIDEODRIVER");
    if (val) {
        /* give them back what they requested: */
        if (SDL20_strcmp(val,  "windib") == 0  ||
            SDL20_strcmp(val, "directx") == 0) {
            return GetDriverName(val, namebuf, maxlen);
        }
    }
    val = SDL20_GetCurrentVideoDriver();
    if (val && SDL20_strcmp(val, "windows") == 0) {
        /* Windows apps may use SDL_VideoDriverName() to check accelerated
         * vs unaccelerated display by using directx and windib.
         * https://github.com/libsdl-org/sdl12-compat/issues/223 */
        val = "directx";
    }
    return GetDriverName(val, namebuf, maxlen);
#else
    return GetDriverName(SDL20_GetCurrentVideoDriver(), namebuf, maxlen);
#endif
}